

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_early_data_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  uint uVar1;
  SSL3_STATE *pSVar2;
  
  if (contents == (CBS *)0x0) {
    pSVar2 = hs->ssl->s3;
    if (((hs->field_0x6c9 & 8) == 0) || ((*(uint *)&pSVar2->field_0xdc >> 0xc & 1) != 0)) {
      if (pSVar2->early_data_reason != ssl_early_data_unknown) {
        return true;
      }
      __assert_fail("ssl->s3->early_data_reason != ssl_early_data_unknown",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x859,
                    "bool bssl::ext_early_data_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    pSVar2->early_data_reason =
         (uint)((*(uint *)&pSVar2->field_0xdc & 0x20) == 0) * 2 + ssl_early_data_peer_declined;
  }
  else {
    pSVar2 = hs->ssl->s3;
    uVar1 = *(uint *)&pSVar2->field_0xdc;
    if ((uVar1 >> 0xc & 1) != 0) {
      __assert_fail("!ssl->s3->used_hello_retry_request",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x861,
                    "bool bssl::ext_early_data_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    if (contents->len != 0) {
      *out_alert = '2';
      return false;
    }
    if ((uVar1 & 0x20) == 0) {
      *out_alert = 'n';
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x86a);
      return false;
    }
    pSVar2->early_data_reason = ssl_early_data_accepted;
    *(ushort *)&pSVar2->field_0xdc = (ushort)uVar1 | 0x200;
  }
  return true;
}

Assistant:

static bool ext_early_data_parse_serverhello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    if (hs->early_data_offered && !ssl->s3->used_hello_retry_request) {
      ssl->s3->early_data_reason = ssl->s3->session_reused
                                       ? ssl_early_data_peer_declined
                                       : ssl_early_data_session_not_resumed;
    } else {
      // We already filled in |early_data_reason| when declining to offer 0-RTT
      // or handling the implicit HelloRetryRequest reject.
      assert(ssl->s3->early_data_reason != ssl_early_data_unknown);
    }
    return true;
  }

  // If we received an HRR, the second ClientHello never offers early data, so
  // the extensions logic will automatically reject early data extensions as
  // unsolicited. This covered by the ServerAcceptsEarlyDataOnHRR test.
  assert(!ssl->s3->used_hello_retry_request);

  if (CBS_len(contents) != 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  if (!ssl->s3->session_reused) {
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    return false;
  }

  ssl->s3->early_data_reason = ssl_early_data_accepted;
  ssl->s3->early_data_accepted = true;
  return true;
}